

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

void cvui::render::window
               (cvui_block_t *theBlock,Rect *theTitleBar,Rect *theContent,String *theTitle)

{
  Scalar_<double> local_2b8;
  Rect_<int> local_298;
  _InputOutputArray local_288 [8];
  Scalar_<double> local_1c8;
  Rect_<int> local_1a8;
  _InputOutputArray local_198;
  Scalar_<double> local_180;
  Point_<int> local_160;
  _InputOutputArray local_158;
  Point_<int> local_140;
  Point aPos;
  Rect_<int> local_118;
  _InputOutputArray local_108;
  Scalar_<double> local_f0;
  Rect_<int> local_cc;
  _InputOutputArray local_b0;
  Mat local_98 [8];
  Mat aOverlay;
  double aAlpha;
  bool aTransparecy;
  String *theTitle_local;
  Rect *theContent_local;
  Rect *theTitleBar_local;
  cvui_block_t *theBlock_local;
  
  cv::Mat::Mat(local_98);
  cv::_InputOutputArray::_InputOutputArray(&local_b0,&theBlock->where);
  cv::Rect_<int>::Rect_(&local_cc,theTitleBar);
  cv::Scalar_<double>::Scalar_(&local_f0,74.0,74.0,74.0,0.0);
  cv::rectangle(&local_b0,&local_cc,&local_f0,1,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_b0);
  theTitleBar->x = theTitleBar->x + 1;
  theTitleBar->y = theTitleBar->y + 1;
  theTitleBar->width = theTitleBar->width + -2;
  theTitleBar->height = theTitleBar->height + -2;
  cv::_InputOutputArray::_InputOutputArray(&local_108,&theBlock->where);
  cv::Rect_<int>::Rect_(&local_118,theTitleBar);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&aPos,33.0,33.0,33.0,0.0);
  cv::rectangle(&local_108,&local_118,&aPos,0xffffffff,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_108);
  cv::Point_<int>::Point_(&local_140,theTitleBar->x + 5,theTitleBar->y + 0xc);
  cv::_InputOutputArray::_InputOutputArray(&local_158,&theBlock->where);
  cv::Point_<int>::Point_(&local_160,&local_140);
  cv::Scalar_<double>::Scalar_(&local_180,206.0,206.0,206.0,0.0);
  cv::putText(0x3fd999999999999a,&local_158,theTitle,&local_160,0,&local_180,1,0x10,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_158);
  cv::_InputOutputArray::_InputOutputArray(&local_198,&theBlock->where);
  cv::Rect_<int>::Rect_(&local_1a8,theContent);
  cv::Scalar_<double>::Scalar_(&local_1c8,74.0,74.0,74.0,0.0);
  cv::rectangle(&local_198,&local_1a8,&local_1c8,1,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_198);
  theContent->x = theContent->x + 1;
  theContent->y = theContent->y + 1;
  theContent->width = theContent->width + -2;
  theContent->height = theContent->height + -2;
  cv::_InputOutputArray::_InputOutputArray(local_288,&theBlock->where);
  cv::Rect_<int>::Rect_(&local_298,theContent);
  cv::Scalar_<double>::Scalar_(&local_2b8,49.0,49.0,49.0,0.0);
  cv::rectangle(local_288,&local_298,&local_2b8,0xffffffff,8,0);
  cv::_InputOutputArray::~_InputOutputArray(local_288);
  cv::Mat::~Mat(local_98);
  return;
}

Assistant:

void window(cvui_block_t& theBlock, cv::Rect& theTitleBar, cv::Rect& theContent, const cv::String& theTitle) {
		bool aTransparecy = false;
		double aAlpha = 0.3;
		cv::Mat aOverlay;

		// Render the title bar.
		// First the border
		cv::rectangle(theBlock.where, theTitleBar, cv::Scalar(0x4A, 0x4A, 0x4A));
		// then the inside
		theTitleBar.x++; theTitleBar.y++; theTitleBar.width -= 2; theTitleBar.height -= 2;
		cv::rectangle(theBlock.where, theTitleBar, cv::Scalar(0x21, 0x21, 0x21), CVUI_FILLED);

		// Render title text.
		cv::Point aPos(theTitleBar.x + 5, theTitleBar.y + 12);
		cv::putText(theBlock.where, theTitle, aPos, cv::FONT_HERSHEY_SIMPLEX, 0.4, cv::Scalar(0xCE, 0xCE, 0xCE), 1, CVUI_ANTIALISED);

		// Render the body.
		// First the border.
		cv::rectangle(theBlock.where, theContent, cv::Scalar(0x4A, 0x4A, 0x4A));

		// Then the filling.
		theContent.x++; theContent.y++; theContent.width -= 2; theContent.height -= 2;

		if (aTransparecy) {
			theBlock.where.copyTo(aOverlay);
			cv::rectangle(aOverlay, theContent, cv::Scalar(0x31, 0x31, 0x31), CVUI_FILLED);
			cv::addWeighted(aOverlay, aAlpha, theBlock.where, 1.0 - aAlpha, 0.0, theBlock.where);

		} else {
			cv::rectangle(theBlock.where, theContent, cv::Scalar(0x31, 0x31, 0x31), CVUI_FILLED);
		}
	}